

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsHasException(bool *hasException)

{
  code *pcVar1;
  bool bVar2;
  JsrtContext *this;
  ScriptContext *this_00;
  undefined4 *puVar3;
  Recycler *this_01;
  ThreadContext *this_02;
  ThreadContext *threadContext;
  Recycler *recycler;
  ScriptContext *scriptContext;
  JsrtContext *currentContext;
  bool *hasException_local;
  
  if (hasException == (bool *)0x0) {
    hasException_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *hasException = false;
    this = JsrtContext::GetCurrent();
    if (this == (JsrtContext *)0x0) {
      hasException_local._4_4_ = JsErrorNoCurrentContext;
    }
    else {
      this_00 = JsrtContext::GetScriptContext(this);
      if (this_00 == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xc3e,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_01 = Js::ScriptContext::GetRecycler(this_00);
      this_02 = Js::ScriptContext::GetThreadContext(this_00);
      if ((this_01 == (Recycler *)0x0) ||
         (bVar2 = Memory::Recycler::IsInObjectBeforeCollectCallback(this_01), !bVar2)) {
        if ((this_01 == (Recycler *)0x0) ||
           (bVar2 = Memory::Recycler::IsHeapEnumInProgress(this_01), !bVar2)) {
          bVar2 = ThreadContext::IsInThreadServiceCallback(this_02);
          if (bVar2) {
            hasException_local._4_4_ = JsErrorInThreadServiceCallback;
          }
          else {
            bVar2 = ThreadContext::IsExecutionDisabled(this_02);
            if (bVar2) {
              hasException_local._4_4_ = JsErrorInDisabledState;
            }
            else {
              bVar2 = Js::ScriptContext::HasRecordedException(this_00);
              *hasException = bVar2;
              hasException_local._4_4_ = JsNoError;
            }
          }
        }
        else {
          hasException_local._4_4_ = JsErrorHeapEnumInProgress;
        }
      }
      else {
        hasException_local._4_4_ = JsErrorInObjectBeforeCollectCallback;
      }
    }
  }
  return hasException_local._4_4_;
}

Assistant:

CHAKRA_API JsHasException(_Out_ bool *hasException)
{
    PARAM_NOT_NULL(hasException);
    *hasException = false;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);
    Recycler *recycler = scriptContext->GetRecycler();
    ThreadContext *threadContext = scriptContext->GetThreadContext();

#ifndef JSRT_VERIFY_RUNTIME_STATE
    if (recycler && recycler->IsInObjectBeforeCollectCallback())
    {
        return JsErrorInObjectBeforeCollectCallback;
    }
#endif

    if (recycler && recycler->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (threadContext->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    *hasException = scriptContext->HasRecordedException();

    return JsNoError;
}